

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::bc1_find_sels_2
               (color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,uint32_t hr,uint32_t hg,
               uint32_t hb,uint8_t *sels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint32_t i;
  int iVar17;
  long lVar18;
  int local_78 [4];
  uint local_68 [4];
  uint local_58 [4];
  int dots [4];
  uint32_t block_b [4];
  uint32_t block_g [4];
  uint32_t block_r [4];
  
  uVar10 = lr >> 2 | lr * 8;
  dots[0] = uVar10;
  uVar14 = lg >> 4 | lg * 4;
  local_58[0] = uVar14;
  uVar5 = lb >> 2 | lb * 8;
  local_68[0] = uVar5;
  uVar12 = hr >> 2 | hr * 8;
  dots[3] = uVar12;
  uVar13 = hg >> 4 | hg * 4;
  local_58[3] = uVar13;
  uVar8 = hb >> 2 | hb * 8;
  local_68[3] = uVar8;
  dots[1] = (uVar12 + uVar10 * 2) / 3;
  local_58[1] = (uVar13 + uVar14 * 2) / 3;
  local_68[1] = (uVar8 + uVar5 * 2) / 3;
  dots[2] = (uVar10 + uVar12 * 2) / 3;
  local_58[2] = (uVar14 + uVar13 * 2) / 3;
  local_68[2] = (uVar5 + uVar8 * 2) / 3;
  for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
    local_78[lVar18] =
         local_68[lVar18] * (uVar8 - uVar5) +
         local_58[lVar18] * (uVar13 - uVar14) + dots[lVar18] * (uVar12 - uVar10);
  }
  iVar7 = local_78[0] + local_78[1];
  iVar4 = local_78[1] + local_78[2];
  iVar6 = local_78[2] + local_78[3];
  iVar1 = (uVar12 - uVar10) * 2;
  iVar2 = (uVar13 - uVar14) * 2;
  iVar3 = (uVar8 - uVar5) * 2;
  for (uVar11 = 0; uVar11 < 0x10; uVar11 = uVar11 + 4) {
    iVar16 = (uint)pSrc_pixels[uVar11].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar11].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar11].field_0.field_0.r * iVar1;
    iVar15 = (uint)pSrc_pixels[uVar11 + 1].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar11 + 1].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar11 + 1].field_0.field_0.r * iVar1;
    iVar17 = (uint)pSrc_pixels[uVar11 + 2].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar11 + 2].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar11 + 2].field_0.field_0.r * iVar1;
    iVar9 = (uint)pSrc_pixels[uVar11 + 3].field_0.field_0.b * iVar3 +
            (uint)pSrc_pixels[uVar11 + 3].field_0.field_0.g * iVar2 +
            (uint)pSrc_pixels[uVar11 + 3].field_0.field_0.r * iVar1;
    sels[uVar11] = "\x03\x02\x01"
                   [(ulong)(iVar16 < iVar6) + (ulong)(iVar16 < iVar4) + (ulong)(iVar16 <= iVar7)];
    sels[uVar11 + 1] =
         "\x03\x02\x01"
         [(ulong)(iVar15 < iVar6) + (ulong)(iVar15 < iVar4) + (ulong)(iVar15 <= iVar7)];
    sels[uVar11 + 2] =
         "\x03\x02\x01"
         [(ulong)(iVar17 < iVar6) + (ulong)(iVar17 < iVar4) + (ulong)(iVar17 <= iVar7)];
    sels[uVar11 + 3] =
         "\x03\x02\x01"[(ulong)(iVar9 < iVar6) + (ulong)(iVar9 < iVar4) + (ulong)(iVar9 <= iVar7)];
  }
  return;
}

Assistant:

static inline void bc1_find_sels_2(const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16])
	{
		uint32_t block_r[4], block_g[4], block_b[4];

		block_r[0] = (lr << 3) | (lr >> 2); block_g[0] = (lg << 2) | (lg >> 4);	block_b[0] = (lb << 3) | (lb >> 2);
		block_r[3] = (hr << 3) | (hr >> 2);	block_g[3] = (hg << 2) | (hg >> 4);	block_b[3] = (hb << 3) | (hb >> 2);
		block_r[1] = (block_r[0] * 2 + block_r[3]) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3]) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3]) / 3;
		block_r[2] = (block_r[3] * 2 + block_r[0]) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0]) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0]) / 3;

		int ar = block_r[3] - block_r[0], ag = block_g[3] - block_g[0], ab = block_b[3] - block_b[0];

		int dots[4];
		for (uint32_t i = 0; i < 4; i++)
			dots[i] = (int)block_r[i] * ar + (int)block_g[i] * ag + (int)block_b[i] * ab;

		int t0 = dots[0] + dots[1], t1 = dots[1] + dots[2], t2 = dots[2] + dots[3];

		ar *= 2; ag *= 2; ab *= 2;

		static const uint8_t s_sels[4] = { 3, 2, 1, 0 };

		for (uint32_t i = 0; i < 16; i += 4)
		{
			const int d0 = pSrc_pixels[i+0].r * ar + pSrc_pixels[i+0].g * ag + pSrc_pixels[i+0].b * ab;
			const int d1 = pSrc_pixels[i+1].r * ar + pSrc_pixels[i+1].g * ag + pSrc_pixels[i+1].b * ab;
			const int d2 = pSrc_pixels[i+2].r * ar + pSrc_pixels[i+2].g * ag + pSrc_pixels[i+2].b * ab;
			const int d3 = pSrc_pixels[i+3].r * ar + pSrc_pixels[i+3].g * ag + pSrc_pixels[i+3].b * ab;

			sels[i+0] = s_sels[(d0 <= t0) + (d0 < t1) + (d0 < t2)];
			sels[i+1] = s_sels[(d1 <= t0) + (d1 < t1) + (d1 < t2)];
			sels[i+2] = s_sels[(d2 <= t0) + (d2 < t1) + (d2 < t2)];
			sels[i+3] = s_sels[(d3 <= t0) + (d3 < t1) + (d3 < t2)];
		}
	}